

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void Imf_3_2::anon_unknown_0::readSampleCountForLineBlock
               (InputStreamMutex *streamData,Data *data,int lineBlockId,
               Array2D<unsigned_int> *sampleCountBuffer,int sampleCountMinY,bool writeToSlice)

{
  Compressor *pCVar1;
  uint *puVar2;
  bool bVar3;
  ulong uVar4;
  ostream *poVar5;
  ArgExc *pAVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint64_t unpackedDataSize;
  uint64_t sampleCountTableDataSize;
  char *readPtr;
  uint64_t packedDataSize;
  char b [4];
  ulong local_208;
  ulong local_200;
  long local_1f8;
  char *local_1f0;
  long local_1e8;
  long local_1e0;
  char *local_1d8;
  ulong local_1d0;
  long local_1c8;
  ulong local_1c0;
  uint local_1b8 [4];
  ostream local_1a8 [376];
  
  local_1f8 = CONCAT44(local_1f8._4_4_,sampleCountMinY);
  (*streamData->is->_vptr_IStream[6])
            (streamData->is,
             (data->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[lineBlockId]);
  if ((data->version & 0x1000) != 0) {
    (*streamData->is->_vptr_IStream[3])(streamData->is,local_1b8,4);
    if (local_1b8[0] != data->partNumber) {
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar6,"Unexpected part number.");
      goto LAB_00163f44;
    }
  }
  (*streamData->is->_vptr_IStream[3])(streamData->is,local_1b8,4);
  uVar15 = local_1b8[0];
  if (local_1b8[0] == data->linesInBuffer * lineBlockId + data->minY) {
    iVar7 = data->linesInBuffer + local_1b8[0] + -1;
    if (data->maxY < iVar7) {
      iVar7 = data->maxY;
    }
    Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(streamData->is,&local_200);
    if ((ulong)(long)data->maxSampleCountTableSize < local_200) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Bad sampleCountTableDataSize read from chunk ",0x2d);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,lineBlockId);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": expected ",0xb);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,data->maxSampleCountTableSize);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," or less, got ",0xe);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar6,(stringstream *)local_1b8);
      __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(streamData->is,&local_1c0);
    Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(streamData->is,&local_208);
    if (((0x7fffffff < local_1c0) || (0x7fffffff < local_208)) || (local_200 >> 0x1f != 0)) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"This version of the library does not",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"support the allocation of data with size  > ",0x2c);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," file table size    :",0x15);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," file unpacked size :",0x15);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," file packed size   :",0x15);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,".\n",2);
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar6,(stringstream *)local_1b8);
      __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    (*streamData->is->_vptr_IStream[3])(streamData->is,(data->sampleCountTableBuffer)._data);
    if (local_200 < (ulong)(long)data->maxSampleCountTableSize) {
      pCVar1 = data->sampleCountTableComp;
      if (pCVar1 == (Compressor *)0x0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Deep scanline data corrupt at chunk ",0x24);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,lineBlockId);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," (sampleCountTableDataSize error)",0x21);
        pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar6,(stringstream *)local_1b8);
        __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      (*pCVar1->_vptr_Compressor[6])
                (pCVar1,(data->sampleCountTableBuffer)._data,local_200,(ulong)uVar15,&local_1f0);
    }
    else {
      local_1f0 = (data->sampleCountTableBuffer)._data;
    }
    if ((int)uVar15 <= iVar7) {
      local_1d8 = data->sampleCountSliceBase;
      local_1e0 = (long)data->sampleCountYStride;
      local_1c8 = (long)data->sampleCountXStride;
      puVar2 = (data->lineSampleCount)._data;
      local_1d0 = local_208;
      lVar8 = (long)(int)uVar15;
      local_1e8 = (long)(int)local_1f8;
      pcVar11 = local_1f0;
      local_1f8 = 0;
      do {
        lVar14 = lVar8 - data->minY;
        puVar2[lVar14] = 0;
        if (data->minX <= data->maxX) {
          lVar9 = (long)data->minX;
          uVar15 = 0;
          do {
            lVar13 = 0;
            pcVar10 = pcVar11;
            do {
              pcVar11 = pcVar10 + 1;
              *(char *)((long)local_1b8 + lVar13) = *pcVar10;
              lVar13 = lVar13 + 1;
              pcVar10 = pcVar11;
            } while ((int)lVar13 != 4);
            uVar12 = local_1b8[0] - uVar15;
            local_1f0 = pcVar11;
            if ((int)local_1b8[0] < (int)uVar15) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,"Deep scanline sampleCount data corrupt at chunk ",0x30);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,lineBlockId);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5," (negative sample count detected)",0x21);
              pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(pAVar6,(stringstream *)local_1b8);
              __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
            }
            if (sampleCountBuffer != (Array2D<unsigned_int> *)0x0) {
              sampleCountBuffer->_data
              [sampleCountBuffer->_sizeY * (lVar8 - local_1e8) + (lVar9 - data->minX)] = uVar12;
            }
            puVar2[lVar14] = puVar2[lVar14] + uVar12;
            if (writeToSlice) {
              *(uint *)(local_1d8 + lVar9 * local_1c8 + lVar8 * local_1e0) = uVar12;
            }
            bVar3 = lVar9 < data->maxX;
            lVar9 = lVar9 + 1;
            uVar15 = local_1b8[0];
          } while (bVar3);
        }
        uVar15 = puVar2[lVar14];
        uVar4 = (long)data->combinedSampleSize * (local_1f8 + (ulong)uVar15);
        if (local_208 <= uVar4 && uVar4 - local_208 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Deep scanline sampleCount data corrupt at chunk ",0x30);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,lineBlockId);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,": pixel data only contains ",0x1b);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," bytes of data but table references at least ",0x2d);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes of sample data",0x15);
          pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar6,(stringstream *)local_1b8);
          __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        (data->gotSampleCount)._data[lVar8 - data->minY] = true;
        lVar8 = lVar8 + 1;
        local_1f8 = local_1f8 + (ulong)uVar15;
      } while (iVar7 + 1 != (int)lVar8);
    }
    return;
  }
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar6,"Unexpected data block y coordinate.");
LAB_00163f44:
  __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
readSampleCountForLineBlock (
    InputStreamMutex*            streamData,
    DeepScanLineInputFile::Data* data,
    int                          lineBlockId,
    Array2D<unsigned int>*       sampleCountBuffer,
    int                          sampleCountMinY,
    bool                         writeToSlice)
{
    streamData->is->seekg (data->lineOffsets[lineBlockId]);

    if (isMultiPart (data->version))
    {
        int partNumber;
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            *streamData->is, partNumber);

        if (partNumber != data->partNumber)
            throw IEX_NAMESPACE::ArgExc ("Unexpected part number.");
    }

    int minY;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, minY);

    //
    // Check the correctness of minY.
    //

    if (minY != data->minY + lineBlockId * data->linesInBuffer)
        throw IEX_NAMESPACE::ArgExc ("Unexpected data block y coordinate.");

    int maxY;
    maxY = min (minY + data->linesInBuffer - 1, data->maxY);

    uint64_t sampleCountTableDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, sampleCountTableDataSize);

    if (sampleCountTableDataSize >
        static_cast<uint64_t> (data->maxSampleCountTableSize))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Bad sampleCountTableDataSize read from chunk "
                << lineBlockId << ": expected " << data->maxSampleCountTableSize
                << " or less, got " << sampleCountTableDataSize);
    }

    uint64_t packedDataSize;
    uint64_t unpackedDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, packedDataSize);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, unpackedDataSize);

    //
    // We make a check on the data size requirements here.
    // Whilst we wish to store 64bit sizes on disk, not all the compressors
    // have been made to work with such data sizes and are still limited to
    // using signed 32 bit (int) for the data size. As such, this version
    // insists that we validate that the data size does not exceed the data
    // type max limit.
    // @TODO refactor the compressor code to ensure full 64-bit support.
    //

    uint64_t compressorMaxDataSize =
        static_cast<uint64_t> (std::numeric_limits<int>::max ());
    if (packedDataSize > compressorMaxDataSize ||
        unpackedDataSize > compressorMaxDataSize ||
        sampleCountTableDataSize > compressorMaxDataSize)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "This version of the library does not"
                << "support the allocation of data with size  > "
                << compressorMaxDataSize
                << " file table size    :" << sampleCountTableDataSize
                << " file unpacked size :" << unpackedDataSize
                << " file packed size   :" << packedDataSize << ".\n");
    }

    streamData->is->read (
        data->sampleCountTableBuffer,
        static_cast<int> (sampleCountTableDataSize));

    const char* readPtr;

    //
    // If the sample count table is compressed, we'll uncompress it.
    //

    if (sampleCountTableDataSize <
        static_cast<uint64_t> (data->maxSampleCountTableSize))
    {
        if (!data->sampleCountTableComp)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Deep scanline data corrupt at chunk "
                    << lineBlockId << " (sampleCountTableDataSize error)");
        }
        data->sampleCountTableComp->uncompress (
            data->sampleCountTableBuffer,
            static_cast<int> (sampleCountTableDataSize),
            minY,
            readPtr);
    }
    else
        readPtr = data->sampleCountTableBuffer;

    char* base    = data->sampleCountSliceBase;
    int   xStride = data->sampleCountXStride;
    int   yStride = data->sampleCountYStride;

    // total number of samples in block: used to check samplecount table doesn't
    // reference more data than exists

    size_t cumulative_total_samples = 0;

    for (int y = minY; y <= maxY; y++)
    {
        int yInDataWindow                    = y - data->minY;
        data->lineSampleCount[yInDataWindow] = 0;

        int lastAccumulatedCount = 0;
        for (int x = data->minX; x <= data->maxX; x++)
        {
            int accumulatedCount, count;

            //
            // Read the sample count for pixel (x, y).
            //

            Xdr::read<CharPtrIO> (readPtr, accumulatedCount);

            // sample count table should always contain monotonically
            // increasing values.
            if (accumulatedCount < lastAccumulatedCount)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Deep scanline sampleCount data corrupt at chunk "
                        << lineBlockId << " (negative sample count detected)");
            }

            count                = accumulatedCount - lastAccumulatedCount;
            lastAccumulatedCount = accumulatedCount;

            //
            // Store the data in internal data structure.
            //

            if (sampleCountBuffer)
            {
                (*sampleCountBuffer)[y - sampleCountMinY][x - data->minX] =
                    count;
            }
            data->lineSampleCount[yInDataWindow] += count;

            //
            // Store the data in external slice
            //
            if (writeToSlice)
            {
                sampleCount (base, xStride, yStride, x, y) = count;
            }
        }
        cumulative_total_samples += data->lineSampleCount[yInDataWindow];
        if (cumulative_total_samples * data->combinedSampleSize >
            unpackedDataSize)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Deep scanline sampleCount data corrupt at chunk "
                    << lineBlockId << ": pixel data only contains "
                    << unpackedDataSize
                    << " bytes of data but table references at least "
                    << cumulative_total_samples * data->combinedSampleSize
                    << " bytes of sample data");
        }

        data->gotSampleCount[y - data->minY] = true;
    }
}